

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLevel1DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,float coordX,int coordY,IVec4 *result)

{
  bool bVar1;
  IVec4 *result_local;
  int coordY_local;
  float coordX_local;
  IntLookupPrecision *prec_local;
  TexLookupScaleMode scaleMode_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  bVar1 = isNearestSampleResultValid<tcu::IntLookupPrecision,int>
                    (access,sampler,prec,coordX,coordY,result);
  return bVar1;
}

Assistant:

bool isLevel1DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const float					coordX,
								 const int						coordY,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coordX, coordY, result);
}